

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

int nsvg__parseTransformArgs(char *str,float *args,int maxNa,int *na)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int extraout_EDX;
  long lVar5;
  byte *s;
  double dVar6;
  char it [64];
  
  *na = 0;
  for (lVar5 = 0; str[lVar5] != '\0'; lVar5 = lVar5 + 1) {
    if (str[lVar5] == '(') {
      s = (byte *)(str + lVar5);
      cVar1 = '(';
      goto LAB_00118e55;
    }
  }
LAB_00118e6b:
  lVar5 = 1;
  goto LAB_00118e6e;
LAB_00118e55:
  if (cVar1 == '\0') goto LAB_00118e6b;
  if (cVar1 == ')') {
    iVar3 = 0;
    iVar4 = maxNa;
    goto LAB_00118e93;
  }
  cVar1 = str[lVar5 + 1];
  lVar5 = lVar5 + 1;
  goto LAB_00118e55;
LAB_00118e93:
  if (s < str + lVar5) {
    bVar2 = *s;
    if ((((ulong)bVar2 < 0x2f) && ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
       (0xf5 < (byte)(bVar2 - 0x3a))) {
      if (maxNa <= iVar3) {
        lVar5 = 0;
        goto LAB_00118e6e;
      }
      s = (byte *)nsvg__parseNumber((char *)s,it,iVar4);
      dVar6 = nsvg__atof(it);
      iVar4 = *na;
      iVar3 = iVar4 + 1;
      *na = iVar3;
      args[iVar4] = (float)dVar6;
      iVar4 = extraout_EDX;
    }
    else {
      s = s + 1;
    }
    goto LAB_00118e93;
  }
LAB_00118e6e:
  return (int)lVar5;
}

Assistant:

static int nsvg__parseTransformArgs(const char* str, float* args, int maxNa, int* na)
{
	const char* end;
	const char* ptr;
	char it[64];

	*na = 0;
	ptr = str;
	while (*ptr && *ptr != '(') ++ptr;
	if (*ptr == 0)
		return 1;
	end = ptr;
	while (*end && *end != ')') ++end;
	if (*end == 0)
		return 1;

	while (ptr < end) {
		if (*ptr == '-' || *ptr == '+' || *ptr == '.' || nsvg__isdigit(*ptr)) {
			if (*na >= maxNa) return 0;
			ptr = nsvg__parseNumber(ptr, it, 64);
			args[(*na)++] = (float)nsvg__atof(it);
		} else {
			++ptr;
		}
	}
	return (int)(end - str);
}